

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int lyp_rfn_apply_ext_(lys_refine *rfn,lys_node *target,LYEXT_SUBSTMT substmt,lys_ext *extdef)

{
  lys_ext_instance ***ext;
  uint8_t *size;
  uint8_t size_00;
  ly_ctx *ctx;
  lys_ext_instance *plVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  lys_ext_instance *plVar5;
  lys_ext_instance **pplVar6;
  LY_ERR *pLVar7;
  byte bVar8;
  long lVar9;
  
  ctx = target->module->ctx;
  ext = &target->ext;
  size = &target->ext_size;
  pplVar6 = rfn->ext;
  iVar3 = -1;
  iVar2 = -1;
  do {
    do {
      iVar2 = lys_ext_iter(pplVar6,rfn->ext_size,(char)iVar2 + '\x01',substmt);
      if (iVar2 == -1) {
        while (iVar3 = lys_ext_iter(*ext,*size,(char)iVar3 + '\x01',substmt), iVar3 != -1) {
          if ((substmt != LYEXT_SUBSTMT_SELF) || ((*ext)[iVar3]->def == extdef)) {
            lyp_ext_instance_rm(ctx,ext,size,(uint8_t)iVar3);
            iVar3 = iVar3 + -1;
          }
        }
        return 0;
      }
    } while ((substmt == LYEXT_SUBSTMT_SELF) && (pplVar6 = rfn->ext, pplVar6[iVar2]->def != extdef))
    ;
    pplVar6 = *ext;
    do {
      iVar3 = lys_ext_iter(pplVar6,*size,(char)iVar3 + '\x01',substmt);
      if ((substmt != LYEXT_SUBSTMT_SELF) || (iVar3 == -1)) {
        if (iVar3 == -1) {
          plVar5 = (lys_ext_instance *)malloc(0x28);
          if (plVar5 == (lys_ext_instance *)0x0) {
            pLVar7 = ly_errno_location();
            *pLVar7 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_rfn_apply_ext_");
          }
          else {
            pplVar6 = (lys_ext_instance **)realloc(*ext,(ulong)*size * 8 + 8);
            if (pplVar6 != (lys_ext_instance **)0x0) {
              target->ext = pplVar6;
              bVar8 = target->ext_size + 1;
              target->ext_size = bVar8;
              iVar3 = bVar8 - 1;
              pplVar6[(ulong)bVar8 - 1] = plVar5;
              lVar9 = (ulong)bVar8 - 1;
              plVar5->parent = target;
              plVar5->parent_type = '\x01';
              plVar5->flags = 0;
              plVar5->insubstmt = (uint8_t)substmt;
              goto LAB_0012593f;
            }
            pLVar7 = ly_errno_location();
            *pLVar7 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_rfn_apply_ext_");
            free(plVar5);
          }
          return 1;
        }
        plVar5 = (*ext)[iVar3];
        break;
      }
      pplVar6 = *ext;
      plVar5 = pplVar6[iVar3];
    } while (plVar5->def != extdef);
    lVar9 = (long)iVar3;
    lys_extension_instances_free(ctx,plVar5->ext,(uint)plVar5->ext_size);
    lydict_remove(ctx,(*ext)[lVar9]->arg_value);
    plVar5 = (*ext)[lVar9];
LAB_0012593f:
    pplVar6 = rfn->ext;
    plVar5->def = pplVar6[iVar2]->def;
    pcVar4 = lydict_insert(ctx,pplVar6[iVar2]->arg_value,0);
    pplVar6 = target->ext;
    pplVar6[lVar9]->arg_value = pcVar4;
    plVar5 = rfn->ext[iVar2];
    size_00 = plVar5->ext_size;
    plVar1 = pplVar6[lVar9];
    plVar1->ext_size = size_00;
    lys_ext_dup(target->module,plVar5->ext,size_00,target,LYEXT_PAR_NODE,&plVar1->ext,
                (unres_schema *)0x0);
    pplVar6 = rfn->ext;
    target->ext[lVar9]->insubstmt_index = pplVar6[iVar2]->insubstmt_index;
  } while( true );
}

Assistant:

static int
lyp_rfn_apply_ext_(struct lys_refine *rfn, struct lys_node *target, LYEXT_SUBSTMT substmt, struct lys_ext *extdef)
{
    struct ly_ctx *ctx;
    int m, n;
    struct lys_ext_instance *new;
    void *reallocated;

    ctx = target->module->ctx; /* shortcut */

    m = n = -1;
    while ((m = lys_ext_iter(rfn->ext, rfn->ext_size, m + 1, substmt)) != -1) {
        /* refine's substatement includes extensions, copy them to the target, replacing the previous
         * substatement's extensions if any. In case of refining the extension itself, we are going to
         * replace only the same extension (pointing to the same definition) */
        if (substmt == LYEXT_SUBSTMT_SELF && rfn->ext[m]->def != extdef) {
            continue;
        }

        /* get the index of the extension to replace in the target node */
        do {
            n = lys_ext_iter(target->ext, target->ext_size, n + 1, substmt);
        } while (n != -1 && substmt == LYEXT_SUBSTMT_SELF && target->ext[n]->def != extdef);

        /* TODO cover complex extension instances
           ((struct lys_ext_instance_complex*)(target->ext[n])->module = target->module;
         */
        if (n == -1) {
            /* nothing to replace, we are going to add it - reallocate */
            new = malloc(sizeof **target->ext);
            if (!new) {
                LOGMEM;
                return EXIT_FAILURE;
            }
            reallocated = realloc(target->ext, (target->ext_size + 1) * sizeof *target->ext);
            if (!reallocated) {
                LOGMEM;
                free(new);
                return EXIT_FAILURE;
            }
            target->ext = reallocated;
            target->ext_size++;

            /* init */
            n = target->ext_size - 1;
            target->ext[n] = new;
            target->ext[n]->parent = target;
            target->ext[n]->parent_type = LYEXT_PAR_NODE;
            target->ext[n]->flags = 0;
            target->ext[n]->insubstmt = substmt;
        } else {
            /* replacing - first remove the allocated data from target */
            lys_extension_instances_free(ctx, target->ext[n]->ext, target->ext[n]->ext_size);
            lydict_remove(ctx, target->ext[n]->arg_value);
        }
        /* common part for adding and replacing */
        target->ext[n]->def = rfn->ext[m]->def;
        /* parent and parent_type do not change */
        target->ext[n]->arg_value = lydict_insert(ctx, rfn->ext[m]->arg_value, 0);
        /* flags do not change */
        target->ext[n]->ext_size = rfn->ext[m]->ext_size;
        lys_ext_dup(target->module, rfn->ext[m]->ext, rfn->ext[m]->ext_size, target, LYEXT_PAR_NODE,
                    &target->ext[n]->ext, NULL);
        /* substmt does not change, but the index must be taken from the refine */
        target->ext[n]->insubstmt_index = rfn->ext[m]->insubstmt_index;
    }

    /* remove the rest of extensions belonging to the original substatement in the target node */
    while ((n = lys_ext_iter(target->ext, target->ext_size, n + 1, substmt)) != -1) {
        if (substmt == LYEXT_SUBSTMT_SELF && target->ext[n]->def != extdef) {
            /* keep this extension */
            continue;
        }

        /* remove the item */
        lyp_ext_instance_rm(ctx, &target->ext, &target->ext_size, n);
        --n;
    }

    return EXIT_SUCCESS;
}